

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitAtomicCmpxchg(PrintExpressionContents *this,AtomicCmpxchg *curr)

{
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  Module *in_R8;
  Name name;
  
  prepareColor(this->o);
  printRMWSize(this->o,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)25>).
                             super_Expression.type.id,curr->bytes);
  std::operator<<(this->o,"cmpxchg");
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.type.id != 1) {
    bVar1 = curr->bytes;
    uVar2 = wasm::Type::getByteSize
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.
                        type);
    if (uVar2 != bVar1) {
      std::operator<<(this->o,"_u");
    }
  }
  Colors::normal(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar3 = std::operator<<(this->o," offset=");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    return;
  }
  return;
}

Assistant:

void visitAtomicCmpxchg(AtomicCmpxchg* curr) {
    prepareColor(o);
    printRMWSize(o, curr->type, curr->bytes);
    o << "cmpxchg";
    if (curr->type != Type::unreachable &&
        curr->bytes != curr->type.getByteSize()) {
      o << "_u";
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
  }